

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

ParseState
icu_63::number::impl::skeleton::parseStem
          (StringSegment *segment,UCharsTrie *stemTrie,SeenMacroProps *seen,MacroProps *macros,
          UErrorCode *status)

{
  char16_t cVar1;
  UNumberFormatRoundingMode UVar2;
  UGroupingStrategy grouping;
  UNumberUnitWidth UVar3;
  UNumberSignDisplay UVar4;
  UNumberDecimalSeparatorDisplay UVar5;
  SymbolsWrapper *this;
  NumberingSystem *ns;
  Notation NVar6;
  Grouper GVar7;
  undefined8 local_c8;
  UNumberGroupingStrategy local_c0;
  Precision local_a8;
  MeasureUnit local_78;
  undefined8 local_60;
  UErrorCode local_58;
  StemEnum local_40;
  UStringTrieResult local_3c;
  StemEnum stem;
  UStringTrieResult stemResult;
  UErrorCode *status_local;
  MacroProps *macros_local;
  SeenMacroProps *seen_local;
  UCharsTrie *stemTrie_local;
  StringSegment *segment_local;
  
  _stem = status;
  status_local = (UErrorCode *)macros;
  macros_local = (MacroProps *)seen;
  seen_local = (SeenMacroProps *)stemTrie;
  stemTrie_local = (UCharsTrie *)segment;
  cVar1 = numparse::impl::StringSegment::charAt(segment,0);
  if (cVar1 == L'.') {
    if ((macros_local->field_0x3 & 1) == 0) {
      macros_local->field_0x3 = 1;
      blueprint_helpers::parseFractionStem
                ((StringSegment *)stemTrie_local,(MacroProps *)status_local,_stem);
      segment_local._4_4_ = STATE_FRACTION_PRECISION;
    }
    else {
      *_stem = U_NUMBER_SKELETON_SYNTAX_ERROR;
      segment_local._4_4_ = STATE_NULL;
    }
  }
  else if (cVar1 == L'@') {
    if ((macros_local->field_0x3 & 1) == 0) {
      macros_local->field_0x3 = 1;
      blueprint_helpers::parseDigitsStem
                ((StringSegment *)stemTrie_local,(MacroProps *)status_local,_stem);
      segment_local._4_4_ = STATE_NULL;
    }
    else {
      *_stem = U_NUMBER_SKELETON_SYNTAX_ERROR;
      segment_local._4_4_ = STATE_NULL;
    }
  }
  else {
    local_3c = UCharsTrie::current((UCharsTrie *)seen_local);
    if ((local_3c == USTRINGTRIE_INTERMEDIATE_VALUE) || (local_3c == USTRINGTRIE_FINAL_VALUE)) {
      local_40 = UCharsTrie::getValue((UCharsTrie *)seen_local);
      switch(local_40) {
      case STEM_COMPACT_SHORT:
      case STEM_COMPACT_LONG:
      case STEM_SCIENTIFIC:
      case STEM_ENGINEERING:
      case STEM_NOTATION_SIMPLE:
        if ((undefined1  [448])((undefined1  [448])*macros_local & (undefined1  [448])0x1) ==
            (undefined1  [448])0x0) {
          *(undefined1 *)macros_local = 1;
          NVar6 = stem_to_object::notation(local_40);
          local_58 = NVar6.fUnion._4_4_;
          local_60 = NVar6._0_8_;
          status_local[3] = local_58;
          *(undefined8 *)(status_local + 1) = local_60;
          if (local_40 == STEM_SCIENTIFIC || local_40 == STEM_ENGINEERING) {
            segment_local._4_4_ = STATE_SCIENTIFIC;
          }
          else {
            segment_local._4_4_ = STATE_NULL;
          }
        }
        else {
          *_stem = U_NUMBER_SKELETON_SYNTAX_ERROR;
          segment_local._4_4_ = STATE_NULL;
        }
        break;
      case STEM_BASE_UNIT:
      case STEM_PERCENT:
      case STEM_PERMILLE:
        if ((macros_local->field_0x1 & 1) == 0) {
          macros_local->field_0x1 = 1;
          stem_to_object::unit(&local_78,local_40);
          MeasureUnit::operator=((MeasureUnit *)(status_local + 4),&local_78);
          MeasureUnit::~MeasureUnit(&local_78);
          segment_local._4_4_ = STATE_NULL;
        }
        else {
          *_stem = U_NUMBER_SKELETON_SYNTAX_ERROR;
          segment_local._4_4_ = STATE_NULL;
        }
        break;
      case STEM_PRECISION_INTEGER:
      case STEM_PRECISION_UNLIMITED:
      case STEM_PRECISION_CURRENCY_STANDARD:
      case STEM_PRECISION_CURRENCY_CASH:
        if ((macros_local->field_0x3 & 1) == 0) {
          macros_local->field_0x3 = 1;
          stem_to_object::precision(&local_a8,local_40);
          *(ulong *)(status_local + 0x13) = CONCAT44(local_a8.fUnion._8_4_,local_a8.fUnion._4_4_);
          *(undefined8 *)(status_local + 0x15) = local_a8._20_8_;
          status_local[0x10] = local_a8.fType;
          status_local[0x11] = local_a8._4_4_;
          *(ulong *)(status_local + 0x12) =
               CONCAT44(local_a8.fUnion._4_4_,local_a8.fUnion.currencyUsage);
          if (local_40 == STEM_PRECISION_INTEGER) {
            segment_local._4_4_ = STATE_FRACTION_PRECISION;
          }
          else {
            segment_local._4_4_ = STATE_NULL;
          }
        }
        else {
          *_stem = U_NUMBER_SKELETON_SYNTAX_ERROR;
          segment_local._4_4_ = STATE_NULL;
        }
        break;
      case STEM_ROUNDING_MODE_CEILING:
      case STEM_ROUNDING_MODE_FLOOR:
      case STEM_ROUNDING_MODE_DOWN:
      case STEM_ROUNDING_MODE_UP:
      case STEM_ROUNDING_MODE_HALF_EVEN:
      case STEM_ROUNDING_MODE_HALF_DOWN:
      case STEM_ROUNDING_MODE_HALF_UP:
      case STEM_ROUNDING_MODE_UNNECESSARY:
        if (((macros_local->notation).fType & NTN_COMPACT) == NTN_SCIENTIFIC) {
          *(undefined1 *)&(macros_local->notation).fType = NTN_COMPACT;
          UVar2 = stem_to_object::roundingMode(local_40);
          status_local[0x18] = UVar2;
          segment_local._4_4_ = STATE_NULL;
        }
        else {
          *_stem = U_NUMBER_SKELETON_SYNTAX_ERROR;
          segment_local._4_4_ = STATE_NULL;
        }
        break;
      case STEM_GROUP_OFF:
      case STEM_GROUP_MIN2:
      case STEM_GROUP_AUTO:
      case STEM_GROUP_ON_ALIGNED:
      case STEM_GROUP_THOUSANDS:
        if (((macros_local->notation).fType & 0x100) == NTN_SCIENTIFIC) {
          *(byte *)((long)&(macros_local->notation).fType + 1) = 1;
          grouping = stem_to_object::groupingStrategy(local_40);
          GVar7 = Grouper::forStrategy(grouping);
          local_c8 = GVar7._0_8_;
          local_c0 = GVar7.fStrategy;
          *(undefined8 *)(status_local + 0x19) = local_c8;
          status_local[0x1b] = local_c0;
          segment_local._4_4_ = STATE_NULL;
        }
        else {
          *_stem = U_NUMBER_SKELETON_SYNTAX_ERROR;
          segment_local._4_4_ = STATE_NULL;
        }
        break;
      case STEM_LATIN:
        if (((macros_local->notation).fUnion.scientific.fEngineeringInterval & 1U) == 0) {
          (macros_local->notation).fUnion.scientific.fEngineeringInterval = '\x01';
          this = (SymbolsWrapper *)(status_local + 0x22);
          ns = NumberingSystem::createInstanceByName("latn",_stem);
          SymbolsWrapper::setTo(this,ns);
          segment_local._4_4_ = STATE_NULL;
        }
        else {
          *_stem = U_NUMBER_SKELETON_SYNTAX_ERROR;
          segment_local._4_4_ = STATE_NULL;
        }
        break;
      case STEM_UNIT_WIDTH_NARROW:
      case STEM_UNIT_WIDTH_SHORT:
      case STEM_UNIT_WIDTH_FULL_NAME:
      case STEM_UNIT_WIDTH_ISO_CODE:
      case STEM_UNIT_WIDTH_HIDDEN:
        if (((ulong)(macros_local->notation).fUnion & 0x100) == 0) {
          (macros_local->notation).fUnion.scientific.fRequireMinInt = true;
          UVar3 = stem_to_object::unitWidth(local_40);
          status_local[0x26] = UVar3;
          segment_local._4_4_ = STATE_NULL;
        }
        else {
          *_stem = U_NUMBER_SKELETON_SYNTAX_ERROR;
          segment_local._4_4_ = STATE_NULL;
        }
        break;
      case STEM_SIGN_AUTO:
      case STEM_SIGN_ALWAYS:
      case STEM_SIGN_NEVER:
      case STEM_SIGN_ACCOUNTING:
      case STEM_SIGN_ACCOUNTING_ALWAYS:
      case STEM_SIGN_EXCEPT_ZERO:
      case STEM_SIGN_ACCOUNTING_EXCEPT_ZERO:
        if (((ulong)(macros_local->notation).fUnion & 0x10000) == 0) {
          *(byte *)((long)&(macros_local->notation).fUnion.compactStyle + 2) = 1;
          UVar4 = stem_to_object::signDisplay(local_40);
          status_local[0x27] = UVar4;
          segment_local._4_4_ = STATE_NULL;
        }
        else {
          *_stem = U_NUMBER_SKELETON_SYNTAX_ERROR;
          segment_local._4_4_ = STATE_NULL;
        }
        break;
      case STEM_DECIMAL_AUTO:
      case STEM_DECIMAL_ALWAYS:
        if (((ulong)(macros_local->notation).fUnion & 0x1000000) == 0) {
          *(byte *)((long)&(macros_local->notation).fUnion.compactStyle + 3) = 1;
          UVar5 = stem_to_object::decimalSeparatorDisplay(local_40);
          status_local[0x28] = UVar5;
          segment_local._4_4_ = STATE_NULL;
        }
        else {
          *_stem = U_NUMBER_SKELETON_SYNTAX_ERROR;
          segment_local._4_4_ = STATE_NULL;
        }
        break;
      case STEM_PRECISION_INCREMENT:
        if ((macros_local->field_0x3 & 1) == 0) {
          macros_local->field_0x3 = 1;
          segment_local._4_4_ = STATE_INCREMENT_PRECISION;
        }
        else {
          *_stem = U_NUMBER_SKELETON_SYNTAX_ERROR;
          segment_local._4_4_ = STATE_NULL;
        }
        break;
      case STEM_MEASURE_UNIT:
        if ((macros_local->field_0x1 & 1) == 0) {
          macros_local->field_0x1 = 1;
          segment_local._4_4_ = STATE_MEASURE_UNIT;
        }
        else {
          *_stem = U_NUMBER_SKELETON_SYNTAX_ERROR;
          segment_local._4_4_ = STATE_NULL;
        }
        break;
      case STEM_PER_MEASURE_UNIT:
        if ((macros_local->field_0x2 & 1) == 0) {
          macros_local->field_0x2 = 1;
          segment_local._4_4_ = STATE_PER_MEASURE_UNIT;
        }
        else {
          *_stem = U_NUMBER_SKELETON_SYNTAX_ERROR;
          segment_local._4_4_ = STATE_NULL;
        }
        break;
      case STEM_CURRENCY:
        if ((macros_local->field_0x1 & 1) == 0) {
          macros_local->field_0x1 = 1;
          segment_local._4_4_ = STATE_CURRENCY_UNIT;
        }
        else {
          *_stem = U_NUMBER_SKELETON_SYNTAX_ERROR;
          segment_local._4_4_ = STATE_NULL;
        }
        break;
      case STEM_INTEGER_WIDTH:
        if (((macros_local->notation).fType & 0x1000000) == NTN_SCIENTIFIC) {
          *(byte *)((long)&(macros_local->notation).fType + 3) = 1;
          segment_local._4_4_ = STATE_INTEGER_WIDTH;
        }
        else {
          *_stem = U_NUMBER_SKELETON_SYNTAX_ERROR;
          segment_local._4_4_ = STATE_NULL;
        }
        break;
      case STEM_NUMBERING_SYSTEM:
        if (((macros_local->notation).fUnion.scientific.fEngineeringInterval & 1U) == 0) {
          (macros_local->notation).fUnion.scientific.fEngineeringInterval = '\x01';
          segment_local._4_4_ = STATE_NUMBERING_SYSTEM;
        }
        else {
          *_stem = U_NUMBER_SKELETON_SYNTAX_ERROR;
          segment_local._4_4_ = STATE_NULL;
        }
        break;
      case STEM_SCALE:
        if (((ulong)(macros_local->notation).fUnion & 0x100000000) == 0) {
          *(undefined1 *)((long)&(macros_local->notation).fUnion + 4) = 1;
          segment_local._4_4_ = STATE_SCALE;
        }
        else {
          *_stem = U_NUMBER_SKELETON_SYNTAX_ERROR;
          segment_local._4_4_ = STATE_NULL;
        }
        break;
      default:
        segment_local._4_4_ = STATE_NULL;
      }
    }
    else {
      *_stem = U_NUMBER_SKELETON_SYNTAX_ERROR;
      segment_local._4_4_ = STATE_NULL;
    }
  }
  return segment_local._4_4_;
}

Assistant:

ParseState
skeleton::parseStem(const StringSegment& segment, const UCharsTrie& stemTrie, SeenMacroProps& seen,
                    MacroProps& macros, UErrorCode& status) {
    // First check for "blueprint" stems, which start with a "signal char"
    switch (segment.charAt(0)) {
        case u'.':
        CHECK_NULL(seen, precision, status);
            blueprint_helpers::parseFractionStem(segment, macros, status);
            return STATE_FRACTION_PRECISION;
        case u'@':
        CHECK_NULL(seen, precision, status);
            blueprint_helpers::parseDigitsStem(segment, macros, status);
            return STATE_NULL;
        default:
            break;
    }

    // Now look at the stemsTrie, which is already be pointing at our stem.
    UStringTrieResult stemResult = stemTrie.current();

    if (stemResult != USTRINGTRIE_INTERMEDIATE_VALUE && stemResult != USTRINGTRIE_FINAL_VALUE) {
        // throw new SkeletonSyntaxException("Unknown stem", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return STATE_NULL;
    }

    auto stem = static_cast<StemEnum>(stemTrie.getValue());
    switch (stem) {

        // Stems with meaning on their own, not requiring an option:

        case STEM_COMPACT_SHORT:
        case STEM_COMPACT_LONG:
        case STEM_SCIENTIFIC:
        case STEM_ENGINEERING:
        case STEM_NOTATION_SIMPLE:
        CHECK_NULL(seen, notation, status);
            macros.notation = stem_to_object::notation(stem);
            switch (stem) {
                case STEM_SCIENTIFIC:
                case STEM_ENGINEERING:
                    return STATE_SCIENTIFIC; // allows for scientific options
                default:
                    return STATE_NULL;
            }

        case STEM_BASE_UNIT:
        case STEM_PERCENT:
        case STEM_PERMILLE:
        CHECK_NULL(seen, unit, status);
            macros.unit = stem_to_object::unit(stem);
            return STATE_NULL;

        case STEM_PRECISION_INTEGER:
        case STEM_PRECISION_UNLIMITED:
        case STEM_PRECISION_CURRENCY_STANDARD:
        case STEM_PRECISION_CURRENCY_CASH:
        CHECK_NULL(seen, precision, status);
            macros.precision = stem_to_object::precision(stem);
            switch (stem) {
                case STEM_PRECISION_INTEGER:
                    return STATE_FRACTION_PRECISION; // allows for "precision-integer/@##"
                default:
                    return STATE_NULL;
            }

        case STEM_ROUNDING_MODE_CEILING:
        case STEM_ROUNDING_MODE_FLOOR:
        case STEM_ROUNDING_MODE_DOWN:
        case STEM_ROUNDING_MODE_UP:
        case STEM_ROUNDING_MODE_HALF_EVEN:
        case STEM_ROUNDING_MODE_HALF_DOWN:
        case STEM_ROUNDING_MODE_HALF_UP:
        case STEM_ROUNDING_MODE_UNNECESSARY:
        CHECK_NULL(seen, roundingMode, status);
            macros.roundingMode = stem_to_object::roundingMode(stem);
            return STATE_NULL;

        case STEM_GROUP_OFF:
        case STEM_GROUP_MIN2:
        case STEM_GROUP_AUTO:
        case STEM_GROUP_ON_ALIGNED:
        case STEM_GROUP_THOUSANDS:
        CHECK_NULL(seen, grouper, status);
            macros.grouper = Grouper::forStrategy(stem_to_object::groupingStrategy(stem));
            return STATE_NULL;

        case STEM_LATIN:
        CHECK_NULL(seen, symbols, status);
            macros.symbols.setTo(NumberingSystem::createInstanceByName("latn", status));
            return STATE_NULL;

        case STEM_UNIT_WIDTH_NARROW:
        case STEM_UNIT_WIDTH_SHORT:
        case STEM_UNIT_WIDTH_FULL_NAME:
        case STEM_UNIT_WIDTH_ISO_CODE:
        case STEM_UNIT_WIDTH_HIDDEN:
        CHECK_NULL(seen, unitWidth, status);
            macros.unitWidth = stem_to_object::unitWidth(stem);
            return STATE_NULL;

        case STEM_SIGN_AUTO:
        case STEM_SIGN_ALWAYS:
        case STEM_SIGN_NEVER:
        case STEM_SIGN_ACCOUNTING:
        case STEM_SIGN_ACCOUNTING_ALWAYS:
        case STEM_SIGN_EXCEPT_ZERO:
        case STEM_SIGN_ACCOUNTING_EXCEPT_ZERO:
        CHECK_NULL(seen, sign, status);
            macros.sign = stem_to_object::signDisplay(stem);
            return STATE_NULL;

        case STEM_DECIMAL_AUTO:
        case STEM_DECIMAL_ALWAYS:
        CHECK_NULL(seen, decimal, status);
            macros.decimal = stem_to_object::decimalSeparatorDisplay(stem);
            return STATE_NULL;

            // Stems requiring an option:

        case STEM_PRECISION_INCREMENT:
        CHECK_NULL(seen, precision, status);
            return STATE_INCREMENT_PRECISION;

        case STEM_MEASURE_UNIT:
        CHECK_NULL(seen, unit, status);
            return STATE_MEASURE_UNIT;

        case STEM_PER_MEASURE_UNIT:
        CHECK_NULL(seen, perUnit, status);
            return STATE_PER_MEASURE_UNIT;

        case STEM_CURRENCY:
        CHECK_NULL(seen, unit, status);
            return STATE_CURRENCY_UNIT;

        case STEM_INTEGER_WIDTH:
        CHECK_NULL(seen, integerWidth, status);
            return STATE_INTEGER_WIDTH;

        case STEM_NUMBERING_SYSTEM:
        CHECK_NULL(seen, symbols, status);
            return STATE_NUMBERING_SYSTEM;

        case STEM_SCALE:
        CHECK_NULL(seen, scale, status);
            return STATE_SCALE;

        default:
            U_ASSERT(false);
            return STATE_NULL; // return a value: silence compiler warning
    }
}